

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O3

bool xercesc_4_0::XMLChar1_0::isPublicIdChar(XMLCh toCheck,XMLCh toCheck2)

{
  XMLCh XVar1;
  XMLCh *pXVar2;
  XMLCh *pXVar3;
  undefined2 in_register_00000032;
  
  if (CONCAT22(in_register_00000032,toCheck2) != 0) {
    return false;
  }
  pXVar3 = L"";
  pXVar2 = L"%\';?Zaz";
  while (pXVar2[-1] != L'\0') {
    if ((ushort)toCheck < (ushort)pXVar2[-1]) goto LAB_0024a810;
    XVar1 = *pXVar2;
    pXVar2 = pXVar2 + 2;
    if ((ushort)toCheck <= (ushort)XVar1) {
      return true;
    }
  }
LAB_0024a828:
  do {
    XVar1 = *pXVar3;
    if (XVar1 == toCheck) {
      return XVar1 != L'\0';
    }
    pXVar3 = pXVar3 + 1;
  } while (XVar1 != L'\0');
  return XVar1 != L'\0';
LAB_0024a810:
  do {
    pXVar3 = pXVar2 + 1;
    XVar1 = *pXVar2;
    pXVar2 = pXVar3;
  } while (XVar1 != L'\0');
  goto LAB_0024a828;
}

Assistant:

bool XMLChar1_0::isPublicIdChar(const XMLCh toCheck, const XMLCh toCheck2)
{
    if (!toCheck2) {
        const XMLCh* curTable = gPublicIdChars;

        // Check the ranges
        while (*curTable)
        {
            //
            //  If the test char is less than the low range, then it's never
            //  going to match any other range, so break out. But we have to
            //  run up to the range terminator first.
            //
            if (toCheck < *curTable++)
            {
                while (*curTable++)
                {
                    // Purposefully empty, we are just running up the pointer
                }
                break;
            }

            // If it's less than or equal to the top of the range, then a match
            if (toCheck <= *curTable++)
                return true;
        }

        // And now test against singles
        while (*curTable)
        {
            if (toCheck == *curTable++)
                return true;
        }
        return false;
    }
    return false;
}